

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cpp
# Opt level: O0

PointCloudColorQuantity * __thiscall
polyscope::PointCloud::addColorQuantityImpl
          (PointCloud *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *colors)

{
  PointCloudColorQuantity *pPVar1;
  string *in_RSI;
  PointCloudColorQuantity *q;
  bool in_stack_00000087;
  QuantityType *in_stack_00000088;
  QuantityStructure<polyscope::PointCloud> *in_stack_00000090;
  PointCloud *in_stack_000000f8;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_00000100;
  string *in_stack_00000108;
  PointCloudColorQuantity *in_stack_00000110;
  string local_40 [32];
  PointCloudColorQuantity *local_20;
  
  pPVar1 = (PointCloudColorQuantity *)operator_new(0x88);
  std::__cxx11::string::string(local_40,in_RSI);
  PointCloudColorQuantity::PointCloudColorQuantity
            (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8);
  std::__cxx11::string::~string(local_40);
  local_20 = pPVar1;
  QuantityStructure<polyscope::PointCloud>::addQuantity
            (in_stack_00000090,in_stack_00000088,in_stack_00000087);
  return local_20;
}

Assistant:

PointCloudColorQuantity* PointCloud::addColorQuantityImpl(std::string name, const std::vector<glm::vec3>& colors) {
  PointCloudColorQuantity* q = new PointCloudColorQuantity(name, colors, *this);
  addQuantity(q);
  return q;
}